

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disconnected_transactions.h
# Opt level: O1

void __thiscall
DisconnectedBlockTransactions::DisconnectedBlockTransactions
          (DisconnectedBlockTransactions *this,size_t max_mem_usage)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this->cachedInnerUsage = 0;
  this->m_max_mem_usage = max_mem_usage;
  (this->queuedTx).
  super__List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->queuedTx;
  (this->queuedTx).
  super__List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->queuedTx;
  (this->queuedTx).
  super__List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl._M_node._M_size = 0;
  SaltedTxidHasher::SaltedTxidHasher((SaltedTxidHasher *)&this->iters_by_txid);
  (this->iters_by_txid)._M_h._M_buckets = &(this->iters_by_txid)._M_h._M_single_bucket;
  (this->iters_by_txid)._M_h._M_bucket_count = 1;
  (this->iters_by_txid)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->iters_by_txid)._M_h._M_element_count = 0;
  (this->iters_by_txid)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    (this->iters_by_txid)._M_h._M_rehash_policy._M_next_resize = 0;
    (this->iters_by_txid)._M_h._M_single_bucket = (__node_base_ptr)0x0;
    return;
  }
  __stack_chk_fail();
}

Assistant:

DisconnectedBlockTransactions(size_t max_mem_usage)
        : m_max_mem_usage{max_mem_usage} {}